

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnDataSegmentData
          (BinaryReaderIR *this,Index index,void *data,Address size)

{
  value_type pDVar1;
  size_type sVar2;
  reference ppDVar3;
  uchar *__dest;
  DataSegment *segment;
  Address size_local;
  void *data_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  sVar2 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::size
                    (&this->module_->data_segments);
  if ((ulong)index == sVar2 - 1) {
    ppDVar3 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::operator[]
                        (&this->module_->data_segments,(ulong)index);
    pDVar1 = *ppDVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pDVar1->data,(ulong)size);
    if (size != 0) {
      __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pDVar1->data);
      memcpy(__dest,data,(ulong)size);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
    return (Result)this_local._4_4_;
  }
  __assert_fail("index == module_->data_segments.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x40e,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnDataSegmentData(Index, const void *, Address)"
               );
}

Assistant:

Result BinaryReaderIR::OnDataSegmentData(Index index,
                                         const void* data,
                                         Address size) {
  assert(index == module_->data_segments.size() - 1);
  DataSegment* segment = module_->data_segments[index];
  segment->data.resize(size);
  if (size > 0) {
    memcpy(segment->data.data(), data, size);
  }
  return Result::Ok;
}